

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Hashes.cpp
# Opt level: O0

uint32_t MicroOAAT(char *key,int len,uint32_t seed)

{
  int iVar1;
  uint32_t h2;
  uint32_t h1;
  uchar *end;
  uchar *str;
  uint32_t seed_local;
  int len_local;
  char *key_local;
  
  h1 = seed ^ 0x3b00;
  h2 = seed << 0xf | seed >> 0x11;
  for (str = (uchar *)key; str < key + len; str = str + 1) {
    iVar1 = *str + h1;
    h2 = h2 + iVar1 * -9;
    h1 = iVar1 * 0x480 | (uint)(iVar1 * 9) >> 0x19;
  }
  return h1 ^ h2;
}

Assistant:

uint32_t
MicroOAAT(const char *key, int len, uint32_t seed) {
#define grol(x,n) (((x)<<(n))|((x)>>(32-(n))))
#define gror(x,n) (((x)>>(n))|((x)<<(32-(n))))
  unsigned char  *str = (unsigned char *)key;
  const unsigned char *const end = (const unsigned char *)str + len;
  uint32_t h1 = seed ^ 0x3b00;
  uint32_t h2 = grol(seed, 15);
  while (str < end) {
    h1 += *str++;
    h1 += h1 << 3; // h1 *= 9
    h2 -= h1;
    // unfortunately, clang produces bad code here,
    // cause it doesn't generate rotl instruction.
    h1 = grol(h1, 7);
  }
  return h1 ^ h2;
#undef grol
#undef gror
}